

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::Clone(SQVM *this,SQObjectPtr *self,SQObjectPtr *target)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  SQArray *x;
  int *in_RSI;
  SQVM *in_RDI;
  SQObjectPtr closure;
  SQObjectPtr newobj;
  SQObjectPtr temp_reg;
  SQObjectPtr *in_stack_ffffffffffffff58;
  SQVM *in_stack_ffffffffffffff60;
  SQInstance *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  SQSharedState *in_stack_ffffffffffffff78;
  SQInstance *in_stack_ffffffffffffff80;
  SQObjectPtr local_60 [2];
  SQTable *in_stack_ffffffffffffffc0;
  SQObjectValue local_38;
  SQObjectPtr local_30;
  int *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  ::SQObjectPtr::SQObjectPtr(&local_30);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffc0);
  iVar1 = *local_18;
  if (iVar1 == 0x8000040) {
    x = SQArray::Clone((SQArray *)in_stack_ffffffffffffff60);
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)
               CONCAT17(in_stack_ffffffffffffff77,
                        CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),x);
    local_1 = 1;
    goto LAB_0013ccf4;
  }
  if (iVar1 == 0xa000020) {
    SQTable::Clone(in_stack_ffffffffffffffc0);
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)
               CONCAT17(in_stack_ffffffffffffff77,
                        CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
               (SQTable *)in_stack_ffffffffffffff68);
  }
  else {
    if (iVar1 != 0xa008000) {
      in_stack_ffffffffffffff60 = (SQVM *)GetTypeName((SQObjectPtr *)0x13ccc3);
      Raise_Error(in_RDI,"cloning a %s",in_stack_ffffffffffffff60);
      local_1 = 0;
      goto LAB_0013ccf4;
    }
    in_stack_ffffffffffffff78 =
         (SQSharedState *)SQInstance::Clone(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)
               CONCAT17(in_stack_ffffffffffffff77,
                        CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
               in_stack_ffffffffffffff68);
  }
  ::SQObjectPtr::SQObjectPtr(local_60);
  if (((local_38.pTable)->super_SQDelegable)._delegate == (SQTable *)0x0) {
LAB_0013cc32:
    bVar2 = false;
  }
  else {
    uVar3 = (*((local_38.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
              _vptr_SQRefCounted[6])(local_38.pTable,in_RDI,0xc,local_60);
    in_stack_ffffffffffffff77 = (undefined1)uVar3;
    if ((uVar3 & 1) == 0) goto LAB_0013cc32;
    Push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    Push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff76 =
         CallMetaMethod((SQVM *)in_stack_ffffffffffffff78,
                        (SQObjectPtr *)
                        CONCAT17(in_stack_ffffffffffffff77,
                                 CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                        (SQMetaMethod)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                        (SQInteger)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if ((bool)in_stack_ffffffffffffff76) goto LAB_0013cc32;
    local_1 = 0;
    bVar2 = true;
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff60);
  if (!bVar2) {
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)
               CONCAT17(in_stack_ffffffffffffff77,
                        CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
               (SQObjectPtr *)in_stack_ffffffffffffff68);
    local_1 = 1;
  }
LAB_0013ccf4:
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff60);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff60);
  return (bool)(local_1 & 1);
}

Assistant:

bool SQVM::Clone(const SQObjectPtr &self,SQObjectPtr &target)
{
    SQObjectPtr temp_reg;
    SQObjectPtr newobj;
    switch(sq_type(self)){
    case OT_TABLE:
        newobj = _table(self)->Clone();
        goto cloned_mt;
    case OT_INSTANCE: {
        newobj = _instance(self)->Clone(_ss(this));
cloned_mt:
        SQObjectPtr closure;
        if(_delegable(newobj)->_delegate && _delegable(newobj)->GetMetaMethod(this,MT_CLONED,closure)) {
            Push(newobj);
            Push(self);
            if(!CallMetaMethod(closure,MT_CLONED,2,temp_reg))
                return false;
        }
        }
        target = newobj;
        return true;
    case OT_ARRAY:
        target = _array(self)->Clone();
        return true;
    default:
        Raise_Error(_SC("cloning a %s"), GetTypeName(self));
        return false;
    }
}